

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)

{
  time_t tVar1;
  time_t entry_time_1;
  time_t entry_time;
  int rc;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    entry_time._4_4_ = -0x17;
    if (channel->req_auth_agent_try_state == libssh2_NB_state_idle) {
      tVar1 = time((time_t *)0x0);
      do {
        entry_time._4_4_ = channel_request_auth_agent(channel,"auth-agent-req@openssh.com",0x1a);
        if (((entry_time._4_4_ != -0x25) || (channel->session == (LIBSSH2_SESSION *)0x0)) ||
           (channel->session->api_block_mode == 0)) break;
        entry_time._4_4_ = _libssh2_wait_socket(channel->session,tVar1);
      } while (entry_time._4_4_ == 0);
      if ((entry_time._4_4_ != 0) && (entry_time._4_4_ != -0x25)) {
        channel->req_auth_agent_try_state = libssh2_NB_state_sent;
      }
    }
    if (channel->req_auth_agent_try_state == libssh2_NB_state_sent) {
      tVar1 = time((time_t *)0x0);
      while ((entry_time._4_4_ = channel_request_auth_agent(channel,"auth-agent-req",0xe),
             entry_time._4_4_ == -0x25 && (channel->session != (LIBSSH2_SESSION *)0x0))) {
        if ((channel->session->api_block_mode == 0) ||
           (entry_time._4_4_ = _libssh2_wait_socket(channel->session,tVar1), entry_time._4_4_ != 0))
        break;
      }
      if ((entry_time._4_4_ != 0) && (entry_time._4_4_ != -0x25)) {
        channel->req_auth_agent_try_state = libssh2_NB_state_sent1;
      }
    }
    if (entry_time._4_4_ == 0) {
      channel->req_auth_agent_try_state = libssh2_NB_state_idle;
    }
    channel_local._4_4_ = entry_time._4_4_;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    rc = LIBSSH2_ERROR_CHANNEL_UNKNOWN;

    /* The current RFC draft for agent forwarding says you're supposed to
     * send "auth-agent-req," but most SSH servers out there right now
     * actually expect "auth-agent-req@openssh.com", so we try that
     * first. */
    if(channel->req_auth_agent_try_state == libssh2_NB_state_idle) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req@openssh.com",
                                                26));

        /* If we failed (but not with EAGAIN), then we move onto
         * the next step to try another request type. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent;
    }

    if(channel->req_auth_agent_try_state == libssh2_NB_state_sent) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req", 14));

        /* If we failed without an EAGAIN, then move on with this
         * state machine. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent1;
    }

    /* If things are good, reset the try state. */
    if(rc == LIBSSH2_ERROR_NONE)
        channel->req_auth_agent_try_state = libssh2_NB_state_idle;

    return rc;
}